

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtcpcompoundpacketbuilder.h
# Opt level: O2

void __thiscall jrtplib::RTCPCompoundPacketBuilder::SDES::~SDES(SDES *this)

{
  ~SDES(this);
  operator_delete(this,0x30);
  return;
}

Assistant:

~SDES() { Clear(); }